

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this)

{
  char cVar1;
  undefined1 n [16];
  undefined1 value [16];
  long lVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  type tVar6;
  char *pcVar7;
  buffer_appender<char> bVar8;
  int iVar9;
  size_t size;
  int iVar10;
  pointer pcVar11;
  undefined1 auVar12 [8];
  uint uVar13;
  char *pcVar14;
  ulong uVar15;
  undefined8 in_stack_fffffffffffffd58;
  _func_int **in_stack_fffffffffffffd60;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  char digits [40];
  anon_class_16_2_3f014a30 local_58;
  undefined1 local_48 [8];
  string groups;
  
  grouping_impl<char>((string *)local_48,(locale_ref)(this->locale).locale_);
  if (groups._M_dataplus._M_p == (pointer)0x0) {
    on_dec(this);
  }
  else {
    cVar3 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
    if (cVar3 != '\0') {
      n._8_8_ = in_stack_fffffffffffffd60;
      n._0_8_ = in_stack_fffffffffffffd58;
      uVar4 = count_digits(*(detail **)&this->abs_value,(uint128_t)n);
      uVar15 = (ulong)uVar4;
      iVar9 = (int)groups._M_dataplus._M_p + uVar4;
      pcVar11 = (pointer)0x0;
      uVar5 = uVar4;
      do {
        if (groups._M_dataplus._M_p == pcVar11) {
LAB_0021558f:
          iVar9 = (int)(uVar5 - 1) /
                  (int)((char *)((long)local_48 + -1))[(long)groups._M_dataplus._M_p] + iVar9;
LAB_0021559f:
          value._8_8_ = in_stack_fffffffffffffd60;
          value._0_8_ = in_stack_fffffffffffffd58;
          format_decimal<char,unsigned__int128>
                    ((detail *)(buffer.store_ + 0x1f0),*(char **)&this->abs_value,
                     (unsigned___int128)value,(int)*(undefined8 *)((long)&this->abs_value + 8));
          buffer.super_buffer<char>._vptr_buffer =
               (_func_int **)&buffer.super_buffer<char>.capacity_;
          buffer.super_buffer<char>.ptr_ = (char *)0x0;
          buffer.super_buffer<char>.size_ = 500;
          iVar9 = iVar9 + this->prefix_size;
          tVar6 = to_unsigned<int>(iVar9);
          buffer<char>::try_resize((buffer<char> *)&stack0xfffffffffffffd60,(ulong)tVar6);
          size = (size_t)iVar9;
          iVar10 = 0;
          pcVar7 = (char *)((long)buffer.super_buffer<char>._vptr_buffer + size);
          auVar12 = local_48;
          do {
            pcVar14 = pcVar7 + -1;
            do {
              pcVar7 = pcVar14;
              if ((int)uVar15 < 1) {
                if (this->prefix_size != 0) {
                  *pcVar7 = '-';
                }
                local_58.data = (char *)buffer.super_buffer<char>._vptr_buffer;
                local_58.size = iVar9;
                bVar8 = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned__int128>::on_num()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                                  ((buffer_appender<char>)
                                   (this->out).
                                   super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                   container,this->specs,size,size,&local_58);
                (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
                     (buffer<char> *)
                     bVar8.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
                basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                          ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                           &stack0xfffffffffffffd60);
                goto LAB_0021569e;
              }
              lVar2 = uVar15 - 9;
              uVar15 = uVar15 - 1;
              *pcVar7 = digits[lVar2];
              cVar1 = *(char *)auVar12;
              pcVar14 = pcVar7 + -1;
            } while (cVar1 < '\x01');
            iVar10 = iVar10 + 1;
            if ((cVar1 != '\x7f') && (iVar10 % (int)cVar1 == 0)) {
              if ((char *)((long)auVar12 + 1) !=
                  (char *)((long)local_48 + (long)groups._M_dataplus._M_p)) {
                iVar10 = 0;
                auVar12 = (undefined1  [8])((long)auVar12 + 1);
              }
              *pcVar14 = cVar3;
              pcVar7 = pcVar14;
            }
          } while( true );
        }
        cVar1 = *(char *)((long)local_48 + (long)pcVar11);
        uVar13 = uVar5 - (int)cVar1;
        if ((uVar13 == 0 || (int)uVar5 < (int)cVar1) || ((byte)(cVar1 + 0x81U) < 0x82)) {
          iVar9 = uVar4 + (int)pcVar11;
          if (groups._M_dataplus._M_p != pcVar11) goto LAB_0021559f;
          goto LAB_0021558f;
        }
        pcVar11 = pcVar11 + 1;
        uVar5 = uVar13;
      } while( true );
    }
    on_dec(this);
  }
LAB_0021569e:
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += prefix_size;
    buffer.resize(to_unsigned(size));
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size;
    for (int i = num_digits - 1; i >= 0; --i) {
      *--p = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      p -= s.size();
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
    }
    if (prefix_size != 0) p[-1] = static_cast<Char>('-');
    using iterator = remove_reference_t<decltype(reserve(out, 0))>;
    auto data = buffer.data();
    out = write_padded<align::right>(out, specs, size, size, [=](iterator it) {
      return copy_str<Char>(data, data + size, it);
    });
  }